

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gls::BuiltinPrecisionTests::
InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
::operator()(InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *this,InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *in1,
            InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *in2)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  
  fVar1 = (in1->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).a;
  fVar2 = (in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).a;
  bVar3 = true;
  if ((fVar2 <= fVar1) && (bVar3 = false, fVar1 <= fVar2)) {
    fVar1 = (in1->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).b;
    fVar2 = (in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).b;
    bVar3 = true;
    if ((fVar2 <= fVar1) &&
       ((bVar3 = false, fVar1 <= fVar2 &&
        (bVar3 = true,
        (in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).c <=
        (in1->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).c)))) {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool operator() (const float& val1, const float& val2) const
	{
		if (deIsNaN(val1))
			return false;
		if (deIsNaN(val2))
			return true;
		return val1 < val2;
	}